

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::~IfcSlab(IfcSlab *this)

{
  *(undefined8 *)&this[-1].field_0x50 = 0x8ae698;
  *(undefined8 *)&this->field_0x38 = 0x8ae7b0;
  *(undefined8 *)&this[-1].field_0xd8 = 0x8ae6c0;
  *(undefined8 *)&this[-1].field_0xe8 = 0x8ae6e8;
  *(undefined8 *)&this[-1].field_0x120 = 0x8ae710;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x8ae738;
  *(undefined8 *)&this[-1].field_0x188 = 0x8ae760;
  *(undefined8 *)this = 0x8ae788;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x50,&PTR_construction_vtable_24__008ae7d0);
  operator_delete(&this[-1].field_0x50,0x198);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}